

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerGate2.hpp
# Opt level: O0

void __thiscall
qclab::qgates::PointerGate2<std::complex<double>_>::PointerGate2
          (PointerGate2<std::complex<double>_> *this,QGate2<std::complex<double>_> *gate,int offset)

{
  int offset_local;
  QGate2<std::complex<double>_> *gate_local;
  PointerGate2<std::complex<double>_> *this_local;
  
  QGate2<std::complex<double>_>::QGate2(&this->super_QGate2<std::complex<double>_>);
  (this->super_QGate2<std::complex<double>_>).super_QObject<std::complex<double>_>._vptr_QObject =
       (_func_int **)&PTR_nbQubits_0075cb08;
  this->offset_ = offset;
  this->gate_ = gate;
  return;
}

Assistant:

PointerGate2( QGate2< T >* gate , const int offset = 0 )
        : offset_( offset )
        , gate_( gate )
        { }